

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.cpp
# Opt level: O3

void * __thiscall phyr::MemoryPool::alloc(MemoryPool *this,size_t byteCount)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  MemoryPool *pMVar6;
  void *ptr;
  void *local_20;
  
  uVar5 = byteCount + 0xf & 0xfffffffffffffff0;
  lVar3 = *(long *)(this + 0x10);
  if (*(ulong *)(this + 0x18) < lVar3 + uVar5) {
    stash(this);
    pMVar6 = this + 0x28;
    do {
      pMVar6 = *(MemoryPool **)pMVar6;
      if (pMVar6 == this + 0x28) goto LAB_001024e7;
      uVar4 = *(ulong *)(pMVar6 + 0x18);
    } while (uVar4 < uVar5);
    *(undefined8 *)(this + 0x20) = *(undefined8 *)(pMVar6 + 0x10);
    *(ulong *)(this + 0x18) = uVar4;
    *(long *)(this + 0x38) = *(long *)(this + 0x38) + -1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pMVar6);
LAB_001024e7:
    pvVar2 = *(void **)(this + 0x20);
    if (pvVar2 == (void *)0x0) {
      uVar4 = *(ulong *)this;
      if (*(ulong *)this < uVar5) {
        uVar4 = uVar5;
      }
      *(ulong *)(this + 0x18) = uVar4;
      iVar1 = posix_memalign(&local_20,(long)PhyRayL1CacheLineSize,uVar4);
      lVar3 = 0;
      pvVar2 = (void *)0x0;
      if (iVar1 == 0) {
        pvVar2 = local_20;
      }
      *(void **)(this + 0x20) = pvVar2;
      *(long *)(this + 8) = *(long *)(this + 8) + *(long *)(this + 0x18);
    }
    else {
      lVar3 = 0;
    }
  }
  else {
    pvVar2 = *(void **)(this + 0x20);
  }
  *(ulong *)(this + 0x10) = uVar5 + lVar3;
  return (void *)((long)pvVar2 + lVar3);
}

Assistant:

void* MemoryPool::alloc(size_t byteCount) {
    // Align {size} with cache line size
    // Optimized alignment calculation, as {MachineAlignment} is a power of 2
    byteCount = (byteCount + MachineAlignment - 1) & ~(MachineAlignment - 1);

    // Check if size requirement is more than what is curently available
    if (curBlockOffset + byteCount > curAllocSize) {
        // Store current block usage data
        stash();

        // Check free blocks for memory
        for (auto it = freeBlocks.begin(); it != freeBlocks.end(); it++) {
            if (it->second >= byteCount) {
                blockPtr = it->first; curAllocSize = it->second;
                // Remove this block from the free set
                freeBlocks.erase(it);
                break;
            }
        }

        // If a block has not yet been found, allocate new
        if (!blockPtr) {
            // Ensure minimum of {blockSize} bytes per block
            curAllocSize = std::max(byteCount, blockSize);
            blockPtr = allocAligned<uint8_t>(curAllocSize);
            // Increment pool size stat
            totalAllocSize += curAllocSize;
        }

        // New memory block allocated, reset block offset
        curBlockOffset = 0;
    }

    void* ptr = blockPtr + curBlockOffset;
    curBlockOffset += byteCount;
    return ptr;
}